

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansi_display_driver.cpp
# Opt level: O3

void __thiscall AnsiDisplayDriver::display(AnsiDisplayDriver *this,Document *doc,ostream *output)

{
  undefined4 uVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  AnsiWrapper wrapper;
  ostream *local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  long local_58;
  long local_50 [2];
  Document *local_40;
  ulong local_38;
  
  AnsiWrapper::AnsiWrapper((AnsiWrapper *)&local_68,output);
  lVar2 = Document::size();
  if (lVar2 != 0) {
    uVar7 = 0;
    local_40 = doc;
    do {
      plVar3 = (long *)Document::operator[]((ulong)doc);
      uVar1 = (**(code **)(*plVar3 + 8))(plVar3);
      local_38 = uVar7;
      switch(uVar1) {
      case 1:
        local_60 = 4;
        AnsiWrapper::fg((Color *)&local_68);
        AnsiWrapper::underline(SUB81(&local_68,0));
        break;
      case 2:
        lVar2 = 2;
        pcVar6 = "  ";
        goto LAB_00122ad7;
      case 3:
        lVar2 = 4;
        pcVar6 = "    ";
LAB_00122ad7:
        std::__ostream_insert<char,std::char_traits<char>>(local_68,pcVar6,lVar2);
        local_60 = 4;
        AnsiWrapper::fg((Color *)&local_68);
        break;
      default:
        std::__ostream_insert<char,std::char_traits<char>>(local_68,"    ",4);
        break;
      case 8:
        lVar2 = 4;
        pcVar6 = "    ";
        goto LAB_00122b13;
      case 9:
        lVar2 = 6;
        pcVar6 = "      ";
LAB_00122b13:
        std::__ostream_insert<char,std::char_traits<char>>(local_68,pcVar6,lVar2);
        local_60 = 6;
        AnsiWrapper::fg((Color *)&local_68);
        std::__ostream_insert<char,std::char_traits<char>>(local_68,"* ",2);
        AnsiWrapper::reset();
        break;
      case 10:
        std::__ostream_insert<char,std::char_traits<char>>(local_68,"    ",4);
        local_60 = 4;
        AnsiWrapper::fg((Color *)&local_68);
        AnsiWrapper::reverse();
      }
      lVar2 = Paragraph::size();
      if (lVar2 != 0) {
        uVar7 = 0;
        do {
          plVar4 = (long *)Paragraph::operator[]((ulong)plVar3);
          if ((plVar4 != (long *)0x0) &&
             (lVar2 = __dynamic_cast(plVar4,&LineElement::typeinfo,&CodeLineElement::typeinfo,0),
             lVar2 != 0)) {
            AnsiWrapper::reverse();
          }
          (**(code **)(*plVar4 + 0x10))(&local_60,plVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_68,(char *)CONCAT44(uStack_5c,local_60),local_58);
          if ((long *)CONCAT44(uStack_5c,local_60) != local_50) {
            operator_delete((long *)CONCAT44(uStack_5c,local_60),local_50[0] + 1);
          }
          AnsiWrapper::reset();
          uVar7 = uVar7 + 1;
          uVar5 = Paragraph::size();
        } while (uVar7 < uVar5);
      }
      AnsiWrapper::reset();
      AnsiWrapper::operator<<((AnsiWrapper *)&local_68,std::endl<char,std::char_traits<char>>);
      doc = local_40;
      uVar7 = local_38 + 1;
      uVar5 = Document::size();
    } while (uVar7 < uVar5);
  }
  return;
}

Assistant:

void AnsiDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p(nullptr);
	LineElement *l(nullptr);
	CodeLineElement *code_le(nullptr);

	AnsiWrapper wrapper(output);

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];
		switch (p->level()) {
			case Paragraph::Level::Title1:
				wrapper.fg(Color::Blue);
				wrapper.underline();
				break;
			case Paragraph::Level::Title2:
				wrapper << "  ";
				wrapper.fg(Color::Blue);
				break;
			case Paragraph::Level::Title3:
				wrapper << "    ";
				wrapper.fg(Color::Blue);
				break;
			case Paragraph::Level::Quote:
				wrapper << "    ";
				wrapper.fg(Color::Blue);
				wrapper.reverse();
				break;
			case Paragraph::Level::UList1:
				wrapper << "    ";
				wrapper.fg(Color::Cyan);
				wrapper << "* ";
				wrapper.reset();
				break;
			case Paragraph::Level::UList2:
				wrapper << "      ";
				wrapper.fg(Color::Cyan);
				wrapper << "* ";
				wrapper.reset();
				break;
			default:
				wrapper << "    ";
				break;

		}
		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];
			code_le = dynamic_cast<CodeLineElement*>(l);

			if (code_le) {
				wrapper.reverse();
			}

			wrapper << l->content();
			
			wrapper.reset();

		}
		wrapper.reset();
		wrapper << endl;
	}
}